

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::CLUFactor<double>::vSolveRight4update
          (CLUFactor<double> *this,double eps,double *vec,int *idx,double *rhs,int *ridx,int rn,
          double *forest,int *forestNum,int *forestIdx)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  double *vec_00;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  uint rn_00;
  uint uVar8;
  uint uVar9;
  uint local_44;
  double local_40;
  double *local_38;
  
  local_44 = rn;
  local_40 = eps;
  local_38 = vec;
  vSolveLright(this,rhs,ridx,(int *)&local_44,eps);
  vec_00 = local_38;
  piVar4 = (this->row).perm;
  if (forest == (double *)0x0) {
    if ((int)local_44 < 1) {
      rn_00 = 0;
    }
    else {
      uVar5 = 0;
      rn_00 = 0;
      do {
        iVar2 = ridx[uVar5];
        if (ABS(rhs[iVar2]) <= local_40) {
          rhs[iVar2] = 0.0;
        }
        else {
          iVar2 = piVar4[iVar2];
          uVar9 = rn_00;
          if (0 < (int)rn_00) {
            do {
              uVar8 = uVar9 - 1;
              uVar6 = uVar8 >> 1;
              if (iVar2 <= ridx[uVar6]) break;
              ridx[uVar9] = ridx[uVar6];
              uVar9 = uVar6;
            } while (1 < uVar8);
          }
          rn_00 = rn_00 + 1;
          ridx[(int)uVar9] = iVar2;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != local_44);
    }
  }
  else {
    if ((int)local_44 < 1) {
      rn_00 = 0;
    }
    else {
      lVar7 = 0;
      rn_00 = 0;
      do {
        iVar2 = ridx[lVar7];
        dVar1 = rhs[iVar2];
        if (ABS(dVar1) <= local_40) {
          rhs[iVar2] = 0.0;
        }
        else {
          *forestIdx = iVar2;
          iVar3 = piVar4[iVar2];
          uVar9 = rn_00;
          if (0 < (int)rn_00) {
            do {
              uVar6 = uVar9 - 1;
              uVar8 = uVar6 >> 1;
              if (iVar3 <= ridx[uVar8]) break;
              ridx[uVar9] = ridx[uVar8];
              uVar9 = uVar8;
            } while (1 < uVar6);
          }
          forestIdx = forestIdx + 1;
          rn_00 = rn_00 + 1;
          ridx[(int)uVar9] = iVar3;
          forest[iVar2] = dVar1;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (int)local_44);
    }
    *forestNum = rn_00;
  }
  local_44 = rn_00;
  local_44 = vSolveUright(this,local_38,idx,rhs,ridx,rn_00,local_40);
  if ((this->l).updateType == 0) {
    local_44 = vSolveUpdateRight(this,vec_00,idx,local_44,local_40);
  }
  return local_44;
}

Assistant:

int CLUFactor<R>::vSolveRight4update(R eps,
                                     R* vec, int* idx,                       /* result */
                                     R* rhs, int* ridx, int rn,              /* rhs    */
                                     R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright(rhs, ridx, rn, eps);
   assert(rn >= 0 && rn <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
      rn = vSolveUpdateRight(vec, idx, rn, eps);

   return rn;
}